

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_int.c
# Opt level: O0

char mpt_type_uint(size_t len)

{
  size_t len_local;
  
  switch(len) {
  case 1:
    len_local._7_1_ = 'y';
    break;
  case 2:
    len_local._7_1_ = 'q';
    break;
  default:
    len_local._7_1_ = '\0';
    break;
  case 4:
    len_local._7_1_ = 'u';
    break;
  case 8:
    len_local._7_1_ = 't';
  }
  return len_local._7_1_;
}

Assistant:

extern char mpt_type_uint(size_t len)
{
	switch (len) {
	  case sizeof(uint8_t):  return 'y';
	  case sizeof(uint16_t): return 'q';
	  case sizeof(uint32_t): return 'u';
	  case sizeof(uint64_t): return 't';
	  default: return 0;
	}
}